

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void Memory::InPlaceFreeListPolicy::MergeDelayFreeList(void *freeList)

{
  FreeObject *pFVar1;
  FreeObject *firstFreeObject;
  FreeObject *nextDelayObject;
  FreeObject *lastDelayObject;
  FreeObject *delayObject;
  int size;
  int i;
  FreeObject **delayFreeObjectLists;
  FreeObject **freeObjectLists;
  void *freeList_local;
  
  if (freeList != (void *)0x0) {
    for (delayObject._4_4_ = 0; delayObject._4_4_ < 0x40; delayObject._4_4_ = delayObject._4_4_ + 1)
    {
      nextDelayObject = (FreeObject *)0x0;
      lastDelayObject = *(FreeObject **)((long)freeList + (long)(int)delayObject._4_4_ * 8 + 0x200);
      while (lastDelayObject != (FreeObject *)0x0) {
        pFVar1 = lastDelayObject->next;
        PrepareFreeObject(lastDelayObject,(long)(int)((delayObject._4_4_ + 1) * 0x10));
        lastDelayObject->next = pFVar1;
        nextDelayObject = lastDelayObject;
        lastDelayObject = pFVar1;
      }
      if (*(long *)((long)freeList + (long)(int)delayObject._4_4_ * 8) == 0) {
        *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8) =
             *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8 + 0x200);
        *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8 + 0x200) = 0;
      }
      else if (nextDelayObject != (FreeObject *)0x0) {
        pFVar1 = *(FreeObject **)((long)freeList + (long)(int)delayObject._4_4_ * 8);
        *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8) =
             *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8 + 0x200);
        nextDelayObject->next = pFVar1;
        *(undefined8 *)((long)freeList + (long)(int)delayObject._4_4_ * 8 + 0x200) = 0;
      }
    }
  }
  return;
}

Assistant:

void InPlaceFreeListPolicy::MergeDelayFreeList(void * freeList)
{
    if (!freeList) return;

    FreeObject ** freeObjectLists = reinterpret_cast<FreeObject **>(freeList);
    FreeObject ** delayFreeObjectLists = freeObjectLists + buckets;

    for (int i = 0; i < buckets; i++)
    {
        int size = (i + 1) << ArenaAllocator::ObjectAlignmentBitShift;
        FreeObject *delayObject = delayFreeObjectLists[i];
        FreeObject *lastDelayObject = nullptr;

        while (delayObject != nullptr)
        {
            FreeObject *nextDelayObject = delayObject->next;
            // DebugPatternFill is required here, because we set isDeleted bit on freed Opnd
            PrepareFreeObject(delayObject, size);
            delayObject->next = nextDelayObject;
            lastDelayObject = delayObject;
            delayObject = nextDelayObject;
        }

        if (freeObjectLists[i] == nullptr)
        {
            freeObjectLists[i] = delayFreeObjectLists[i];
            delayFreeObjectLists[i] = nullptr;
        }
        else if (lastDelayObject != nullptr) {
            FreeObject * firstFreeObject = freeObjectLists[i];
            freeObjectLists[i] = delayFreeObjectLists[i];
            lastDelayObject->next = firstFreeObject;
            delayFreeObjectLists[i] = nullptr;
        }
    }
}